

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cartesian_cubic.hpp
# Opt level: O2

void __thiscall
sisl::cartesian_cubic<float>::cartesian_cubic(cartesian_cubic<float> *this,uint rx,uint ry,uint rz)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  
  (this->super_base_lattice<float>)._vptr_base_lattice = (_func_int **)&PTR_operator___00129bd8;
  this->_nx = rx;
  this->_ny = ry;
  this->_nz = rz;
  array_n<float,_3,_std::allocator<float>_>::array_n
            (&this->_array,rx + 1,(ulong)(ry + 1),(ulong)(rz + 1));
  auVar1._4_4_ = 0;
  auVar1._0_4_ = rx;
  auVar1._8_4_ = ry;
  auVar1._12_4_ = 0;
  auVar2._0_8_ = SUB168(auVar1 | _DAT_0011b090,0) - (double)DAT_0011b090;
  auVar2._8_8_ = SUB168(auVar1 | _DAT_0011b090,8) - DAT_0011b090._8_8_;
  auVar1 = divpd(_DAT_0011b0a0,auVar2);
  this->_sx = (double)auVar1._0_8_;
  this->_sy = (double)auVar1._8_8_;
  this->_sz = 1.0 / (double)rz;
  this->__zero = 0.0;
  return;
}

Assistant:

cartesian_cubic(unsigned int rx, unsigned int ry, unsigned int rz) : _array(rx+1, ry+1, rz+1), _nx(rx), _ny(ry), _nz(rz){
            // Setup basis scaling factors
            _sx = 1./double(rx);
            _sy = 1./double(ry);
            _sz = 1./double(rz);

            // A little hack to help OOB access
            __zero = 0;
        }